

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::Interpreter::ReParseMultiNetworkSyntax
          (Error *__return_storage_ptr__,Interpreter *this,Expression *aExpr,Expression *aRetExpr)

{
  char cVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer __x;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  long local_148;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  string *local_100;
  writer write;
  string lastKey;
  string prefix;
  StringArray *arrays [6];
  writer write_1;
  undefined1 local_58 [40];
  
  arrays[2] = &(this->mContext).mDomAliases;
  arrays[3] = &(this->mContext).mExportFiles;
  arrays[4] = &(this->mContext).mImportFiles;
  arrays[5] = &(this->mContext).mCommandKeys;
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  local_100 = &__return_storage_ptr__->mMessage;
  bVar4 = false;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  lastKey._M_dataplus._M_p = (pointer)&lastKey.field_2;
  lastKey._M_string_length = 0;
  lastKey.field_2._M_local_buf[0] = '\0';
  __x = (aExpr->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_148 = 0;
  arrays[0] = aRetExpr;
  arrays[1] = (StringArray *)this;
  do {
    if (__x == pbVar2) goto LAB_00201b92;
    std::__cxx11::string::substr((ulong)&prefix,(ulong)__x);
    bVar3 = std::operator==(&prefix,"--");
    if (bVar3) {
      if (bVar4) {
        local_138.types_[0] = string_type;
        local_138.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "keyword \'{}\' used with no parameter";
        local_138.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
        local_138.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_138.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_138.context_.types_ = local_138.types_;
        local_138.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        pcVar5 = "keyword \'{}\' used with no parameter";
        write.handler_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_138.context_.types_;
        while (pcVar5 != "") {
          cVar1 = *pcVar5;
          pcVar6 = pcVar5;
          while (cVar1 != '{') {
            pcVar6 = pcVar6 + 1;
            if (pcVar6 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()(&write,pcVar5,"");
              goto LAB_00201a78;
            }
            cVar1 = *pcVar6;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar5,pcVar6);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar6,"",&local_138);
        }
LAB_00201a78:
        local_138._0_8_ = lastKey._M_dataplus._M_p;
        local_138.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             (char *)lastKey._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x23;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_138;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&write_1,(v10 *)"keyword \'{}\' used with no parameter",fmt,args);
        local_58._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)(local_58 + 8),(string *)&write_1);
        Error::operator=(__return_storage_ptr__,(Error *)local_58);
        std::__cxx11::string::~string((string *)(local_58 + 8));
        std::__cxx11::string::~string((string *)&write_1);
        bVar3 = false;
        iVar7 = 6;
      }
      else {
        std::__cxx11::string::_M_assign((string *)&lastKey);
        bVar4 = std::operator==(__x,"--nwk");
        iVar7 = 0;
        if (bVar4) {
          local_148 = 1;
        }
        else {
          bVar4 = std::operator==(__x,"--dom");
          if (bVar4) {
            local_148 = 2;
          }
          else {
            bVar4 = std::operator==(__x,"--export");
            if (!bVar4) {
              bVar4 = std::operator==(__x,"--import");
              bVar3 = true;
              if (!bVar4) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(arrays[5],__x);
                local_148 = 5;
                goto LAB_00201a31;
              }
              local_148 = 4;
              bVar4 = true;
              goto LAB_00201b22;
            }
            local_148 = 3;
          }
        }
        bVar4 = true;
        bVar3 = true;
        iVar7 = 0;
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(arrays[local_148],__x);
LAB_00201a31:
      bVar4 = false;
      bVar3 = true;
      iVar7 = 0;
    }
LAB_00201b22:
    std::__cxx11::string::~string((string *)&prefix);
    __x = __x + 1;
  } while (bVar3);
  if (iVar7 != 6) {
    if (iVar7 != 2) {
      std::__cxx11::string::~string((string *)&lastKey);
      this_00 = local_100;
      goto LAB_00201cb8;
    }
LAB_00201b92:
    if (bVar4) {
      local_138.types_[0] = string_type;
      local_138.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "keyword \'{}\' used with no parameter";
      local_138.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
      local_138.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_138.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_138.context_.types_ = local_138.types_;
      local_138.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      pcVar5 = "keyword \'{}\' used with no parameter";
      write_1.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_138.context_.types_;
      while (pcVar5 != "") {
        cVar1 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&write_1,pcVar5,"");
            goto LAB_00201c45;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&write_1,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar6,"",&local_138);
      }
LAB_00201c45:
      local_138._0_8_ = lastKey._M_dataplus._M_p;
      local_138.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)lastKey._M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x23;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_138;
      ::fmt::v10::vformat_abi_cxx11_
                (&prefix,(v10 *)"keyword \'{}\' used with no parameter",fmt_00,args_00);
      local_58._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_58 + 8),(string *)&prefix);
      Error::operator=(__return_storage_ptr__,(Error *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)&prefix);
    }
  }
  this_00 = &lastKey;
LAB_00201cb8:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::ReParseMultiNetworkSyntax(const Expression &aExpr, Expression &aRetExpr)
{
    enum
    {
        ST_COMMAND,
        ST_NETWORK,
        ST_DOMAIN,
        ST_EXPORT,
        ST_IMPORT,
        ST_CMD_KEYS
    };
    StringArray *arrays[] = {[ST_COMMAND]  = &aRetExpr,
                             [ST_NETWORK]  = &mContext.mNwkAliases,
                             [ST_DOMAIN]   = &mContext.mDomAliases,
                             [ST_EXPORT]   = &mContext.mExportFiles,
                             [ST_IMPORT]   = &mContext.mImportFiles,
                             [ST_CMD_KEYS] = &mContext.mCommandKeys};
    Error        error;

    uint8_t     state = ST_COMMAND;
    bool        inKey = false;
    std::string lastKey;

    for (const auto &word : aExpr)
    {
        std::string prefix = word.substr(0, 2);

        /*
         * Note: the syntax allows multiple specification of the same key
         *
         * Example: the cases below are parsed equivalently
         *  --nwk nid1 nid2 nid3 --export path
         *  --nwk nid1 --nwk nid2 nid3 --export path
         *  --nwk nid1 --export path --nwk nid2 --nwk nid3
         */

        if (prefix == "--")
        {
            VerifyOrExit(!inKey, error = ERROR_INVALID_ARGS(SYNTAX_NO_PARAM, lastKey));
            lastKey = word;
            inKey   = true;
            if (word == KEYWORD_NETWORK)
                state = ST_NETWORK;
            else if (word == KEYWORD_DOMAIN)
                state = ST_DOMAIN;
            else if (word == KEYWORD_EXPORT)
                state = ST_EXPORT;
            else if (word == KEYWORD_IMPORT)
                state = ST_IMPORT;
            else
            {
                // Some commands have command line parameters that are to be passed without any change including the
                // key.
                inKey = false;
                state = ST_CMD_KEYS;
                arrays[state]->push_back(word);
            }
        }
        else
        {
            inKey = false;
            // Note: avoid accidental conversion of the PSKd to lower case (see TS 8.2, Joining Device Credential
            // in the table 8.2
            arrays[state]->push_back(word);
        }
    }
    if (inKey) // test if we exit for() with trailing keyword
    {
        error = ERROR_INVALID_ARGS(SYNTAX_NO_PARAM, lastKey);
    }
exit:
    return error;
}